

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O0

int loader_impl_clear(void *handle)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long *plVar4;
  long in_RDI;
  loader_handle_impl iterator_handle_impl;
  int result;
  size_t iterator;
  loader_impl impl;
  loader_handle_impl handle_impl;
  ulong local_28;
  loader_handle_impl handle_impl_00;
  uint local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else {
    handle_impl_00 = *(loader_handle_impl *)(in_RDI + 8);
    lVar1 = set_remove(handle_impl_00->iface,in_RDI + 0x18);
    lVar2 = set_remove(*(undefined8 *)handle_impl_00->path,*(undefined8 *)(in_RDI + 0x1018));
    local_4 = (uint)((lVar2 == in_RDI ^ 0xffU) & 1 | (lVar1 == in_RDI ^ 0xffU) & 1);
    local_28 = 0;
    while( true ) {
      uVar3 = vector_size(*(undefined8 *)(handle_impl_00->path + 8));
      if (uVar3 <= local_28) break;
      plVar4 = (long *)vector_at(*(undefined8 *)(handle_impl_00->path + 8),local_28);
      if (in_RDI == *plVar4) {
        vector_erase(*(undefined8 *)(handle_impl_00->path + 8),local_28);
        break;
      }
      local_28 = local_28 + 1;
    }
    loader_impl_destroy_handle(handle_impl_00);
  }
  return local_4;
}

Assistant:

int loader_impl_clear(void *handle)
{
	if (handle != NULL)
	{
		loader_handle_impl handle_impl = handle;

		loader_impl impl = handle_impl->impl;

		size_t iterator;

		/* Remove the handle from the path indexing set */
		int result = !(set_remove(impl->handle_impl_path_map, (set_key)handle_impl->path) == handle_impl);

		/* Remove the handle from the pointer indexing set */
		result |= !(set_remove(impl->handle_impl_map, (set_key)handle_impl->module) == handle_impl);

		/* Search for the handle in the initialization order list and remove it */
		for (iterator = 0; iterator < vector_size(impl->handle_impl_init_order); ++iterator)
		{
			loader_handle_impl iterator_handle_impl = vector_at_type(impl->handle_impl_init_order, iterator, loader_handle_impl);

			if (handle_impl == iterator_handle_impl)
			{
				vector_erase(impl->handle_impl_init_order, iterator);
				break;
			}
		}

		loader_impl_destroy_handle(handle_impl);

		return result;
	}

	return 1;
}